

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

string * __thiscall
Context::op_setFloatPrecision
          (Context *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  size_type sVar2;
  undefined8 *puVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  int float_precision;
  allocator local_8d [21];
  string *in_stack_ffffffffffffff88;
  IntegerInstance *in_stack_ffffffffffffff90;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,0);
  IntegerInstance::IntegerInstance(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  iVar1 = IntegerInstance::value((IntegerInstance *)(local_8d + 0xd));
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1a62c0);
  if (iVar1 < 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  *(int *)(in_RSI + 0x200) = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"null",local_8d);
  std::allocator<char>::~allocator((allocator<char> *)local_8d);
  return in_RDI;
}

Assistant:

std::string Context::op_setFloatPrecision(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int float_precision = IntegerInstance(arguments[0]).value();
    if (float_precision <= 0)
        throw EXC_INVALID_ARGUMENT;
    _float_precision = float_precision;
    return "null";
}